

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TextureCubeArray_GL.cpp
# Opt level: O0

void __thiscall
Diligent::TextureCubeArray_GL::AttachToFramebuffer
          (TextureCubeArray_GL *this,TextureViewDesc *ViewDesc,GLenum AttachmentPoint,
          FRAMEBUFFER_TARGET_FLAGS Targets)

{
  PFNGLFRAMEBUFFERTEXTUREPROC p_Var1;
  PFNGLFRAMEBUFFERTEXTURELAYERPROC p_Var2;
  undefined4 uVar3;
  FRAMEBUFFER_TARGET_FLAGS FVar4;
  GLuint GVar5;
  Char *pCVar6;
  undefined4 in_register_0000000c;
  char (*Args_1) [99];
  TextureCubeArray_GL *Args_1_00;
  undefined1 local_128 [8];
  string msg_6;
  string msg_5;
  undefined1 local_e0 [4];
  GLenum err_3;
  string msg_4;
  undefined1 local_b8 [4];
  GLenum err_2;
  string msg_3;
  string msg_2;
  undefined1 local_70 [4];
  GLenum err_1;
  string msg_1;
  GLenum err;
  undefined1 local_40 [8];
  string msg;
  FRAMEBUFFER_TARGET_FLAGS Targets_local;
  GLenum AttachmentPoint_local;
  TextureViewDesc *ViewDesc_local;
  TextureCubeArray_GL *this_local;
  
  Args_1 = (char (*) [99])CONCAT44(in_register_0000000c,Targets);
  msg.field_2._8_4_ = Targets;
  msg.field_2._12_4_ = AttachmentPoint;
  if ((ViewDesc->field_6).NumArraySlices == 1) {
    FVar4 = Diligent::operator&(Targets,FRAMEBUFFER_TARGET_FLAG_DRAW);
    if (FVar4 != FRAMEBUFFER_TARGET_FLAG_NONE) {
      if ((ViewDesc->ViewType != TEXTURE_VIEW_RENDER_TARGET) &&
         (ViewDesc->ViewType != TEXTURE_VIEW_DEPTH_STENCIL)) {
        FormatString<char[26],char[99]>
                  ((string *)local_40,(Diligent *)"Debug expression failed:\n",
                   (char (*) [26])
                   "ViewDesc.ViewType == TEXTURE_VIEW_RENDER_TARGET || ViewDesc.ViewType == TEXTURE_VIEW_DEPTH_STENCIL"
                   ,Args_1);
        pCVar6 = (Char *)std::__cxx11::string::c_str();
        DebugAssertionFailed
                  (pCVar6,"AttachToFramebuffer",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/TextureCubeArray_GL.cpp"
                   ,0x111);
        std::__cxx11::string::~string((string *)local_40);
      }
      uVar3 = msg.field_2._12_4_;
      p_Var2 = __glewFramebufferTextureLayer;
      GVar5 = GLObjectWrappers::GLObjWrapper::operator_cast_to_unsigned_int
                        ((GLObjWrapper *)&(this->super_TextureBaseGL).m_GlTexture);
      (*p_Var2)(0x8ca9,uVar3,GVar5,ViewDesc->MostDetailedMip,(ViewDesc->field_5).FirstArraySlice);
      msg_1.field_2._8_4_ = glGetError();
      if (msg_1.field_2._8_4_ != 0) {
        LogError<false,char[59],char[17],unsigned_int>
                  (false,"AttachToFramebuffer",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/TextureCubeArray_GL.cpp"
                   ,0x113,(char (*) [59])
                          "Failed to attach texture cubemap array to draw framebuffer",
                   (char (*) [17])"\nGL Error Code: ",(uint *)(msg_1.field_2._M_local_buf + 8));
        FormatString<char[6]>((string *)local_70,(char (*) [6])0xe8e72e);
        pCVar6 = (Char *)std::__cxx11::string::c_str();
        DebugAssertionFailed
                  (pCVar6,"AttachToFramebuffer",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/TextureCubeArray_GL.cpp"
                   ,0x113);
        std::__cxx11::string::~string((string *)local_70);
      }
    }
    FVar4 = Diligent::operator&(msg.field_2._8_4_,FRAMEBUFFER_TARGET_FLAG_READ);
    uVar3 = msg.field_2._12_4_;
    p_Var2 = __glewFramebufferTextureLayer;
    if (FVar4 != FRAMEBUFFER_TARGET_FLAG_NONE) {
      GVar5 = GLObjectWrappers::GLObjWrapper::operator_cast_to_unsigned_int
                        ((GLObjWrapper *)&(this->super_TextureBaseGL).m_GlTexture);
      (*p_Var2)(0x8ca8,uVar3,GVar5,ViewDesc->MostDetailedMip,(ViewDesc->field_5).FirstArraySlice);
      msg_2.field_2._12_4_ = glGetError();
      if (msg_2.field_2._12_4_ != 0) {
        LogError<false,char[59],char[17],unsigned_int>
                  (false,"AttachToFramebuffer",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/TextureCubeArray_GL.cpp"
                   ,0x118,(char (*) [59])
                          "Failed to attach texture cubemap array to read framebuffer",
                   (char (*) [17])"\nGL Error Code: ",(uint *)(msg_2.field_2._M_local_buf + 0xc));
        FormatString<char[6]>((string *)((long)&msg_3.field_2 + 8),(char (*) [6])0xe8e72e);
        pCVar6 = (Char *)std::__cxx11::string::c_str();
        DebugAssertionFailed
                  (pCVar6,"AttachToFramebuffer",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/TextureCubeArray_GL.cpp"
                   ,0x118);
        std::__cxx11::string::~string((string *)(msg_3.field_2._M_local_buf + 8));
      }
    }
  }
  else if ((ViewDesc->field_6).NumArraySlices ==
           (this->super_TextureBaseGL).super_TextureBase<Diligent::EngineGLImplTraits>.
           super_DeviceObjectBase<Diligent::ITextureGL,_Diligent::RenderDeviceGLImpl,_Diligent::TextureDesc>
           .m_Desc.field_3.ArraySize) {
    Args_1_00 = this;
    FVar4 = Diligent::operator&(Targets,FRAMEBUFFER_TARGET_FLAG_DRAW);
    if (FVar4 != FRAMEBUFFER_TARGET_FLAG_NONE) {
      if ((ViewDesc->ViewType != TEXTURE_VIEW_RENDER_TARGET) &&
         (ViewDesc->ViewType != TEXTURE_VIEW_DEPTH_STENCIL)) {
        FormatString<char[26],char[99]>
                  ((string *)local_b8,(Diligent *)"Debug expression failed:\n",
                   (char (*) [26])
                   "ViewDesc.ViewType == TEXTURE_VIEW_RENDER_TARGET || ViewDesc.ViewType == TEXTURE_VIEW_DEPTH_STENCIL"
                   ,(char (*) [99])Args_1_00);
        pCVar6 = (Char *)std::__cxx11::string::c_str();
        DebugAssertionFailed
                  (pCVar6,"AttachToFramebuffer",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/TextureCubeArray_GL.cpp"
                   ,0x120);
        std::__cxx11::string::~string((string *)local_b8);
      }
      uVar3 = msg.field_2._12_4_;
      p_Var1 = __glewFramebufferTexture;
      GVar5 = GLObjectWrappers::GLObjWrapper::operator_cast_to_unsigned_int
                        ((GLObjWrapper *)&(this->super_TextureBaseGL).m_GlTexture);
      (*p_Var1)(0x8ca9,uVar3,GVar5,ViewDesc->MostDetailedMip);
      msg_4.field_2._12_4_ = glGetError();
      if (msg_4.field_2._12_4_ != 0) {
        LogError<false,char[59],char[17],unsigned_int>
                  (false,"AttachToFramebuffer",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/TextureCubeArray_GL.cpp"
                   ,0x122,(char (*) [59])
                          "Failed to attach texture cubemap array to draw framebuffer",
                   (char (*) [17])"\nGL Error Code: ",(uint *)(msg_4.field_2._M_local_buf + 0xc));
        FormatString<char[6]>((string *)local_e0,(char (*) [6])0xe8e72e);
        pCVar6 = (Char *)std::__cxx11::string::c_str();
        DebugAssertionFailed
                  (pCVar6,"AttachToFramebuffer",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/TextureCubeArray_GL.cpp"
                   ,0x122);
        std::__cxx11::string::~string((string *)local_e0);
      }
    }
    FVar4 = Diligent::operator&(msg.field_2._8_4_,FRAMEBUFFER_TARGET_FLAG_READ);
    uVar3 = msg.field_2._12_4_;
    p_Var1 = __glewFramebufferTexture;
    if (FVar4 != FRAMEBUFFER_TARGET_FLAG_NONE) {
      GVar5 = GLObjectWrappers::GLObjWrapper::operator_cast_to_unsigned_int
                        ((GLObjWrapper *)&(this->super_TextureBaseGL).m_GlTexture);
      (*p_Var1)(0x8ca8,uVar3,GVar5,ViewDesc->MostDetailedMip);
      msg_5.field_2._12_4_ = glGetError();
      if (msg_5.field_2._12_4_ != 0) {
        LogError<false,char[59],char[17],unsigned_int>
                  (false,"AttachToFramebuffer",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/TextureCubeArray_GL.cpp"
                   ,0x127,(char (*) [59])
                          "Failed to attach texture cubemap array to read framebuffer",
                   (char (*) [17])"\nGL Error Code: ",(uint *)(msg_5.field_2._M_local_buf + 0xc));
        FormatString<char[6]>((string *)((long)&msg_6.field_2 + 8),(char (*) [6])0xe8e72e);
        pCVar6 = (Char *)std::__cxx11::string::c_str();
        DebugAssertionFailed
                  (pCVar6,"AttachToFramebuffer",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/TextureCubeArray_GL.cpp"
                   ,0x127);
        std::__cxx11::string::~string((string *)(msg_6.field_2._M_local_buf + 8));
      }
    }
  }
  else {
    FormatString<char[76]>
              ((string *)local_128,
               (char (*) [76])
               "Only one slice or the entire cubemap array can be attached to a framebuffer");
    pCVar6 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar6,"AttachToFramebuffer",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/TextureCubeArray_GL.cpp"
               ,300);
    std::__cxx11::string::~string((string *)local_128);
  }
  return;
}

Assistant:

void TextureCubeArray_GL::AttachToFramebuffer(const TextureViewDesc& ViewDesc, GLenum AttachmentPoint, FRAMEBUFFER_TARGET_FLAGS Targets)
{
    // Same as for 2D array textures

    // Every OpenGL API call that operates on cubemap array textures takes layer-faces, not array layers.
    // So the parameters that represent the Z component are layer-faces.
    if (ViewDesc.NumArraySlices == 1)
    {
        // Texture name must either be zero or the name of an existing 3D texture, 1D or 2D array texture,
        // cube map array texture, or multisample array texture.
        if (Targets & FRAMEBUFFER_TARGET_FLAG_DRAW)
        {
            VERIFY_EXPR(ViewDesc.ViewType == TEXTURE_VIEW_RENDER_TARGET || ViewDesc.ViewType == TEXTURE_VIEW_DEPTH_STENCIL);
            glFramebufferTextureLayer(GL_DRAW_FRAMEBUFFER, AttachmentPoint, m_GlTexture, ViewDesc.MostDetailedMip, ViewDesc.FirstArraySlice);
            DEV_CHECK_GL_ERROR("Failed to attach texture cubemap array to draw framebuffer");
        }
        if (Targets & FRAMEBUFFER_TARGET_FLAG_READ)
        {
            glFramebufferTextureLayer(GL_READ_FRAMEBUFFER, AttachmentPoint, m_GlTexture, ViewDesc.MostDetailedMip, ViewDesc.FirstArraySlice);
            DEV_CHECK_GL_ERROR("Failed to attach texture cubemap array to read framebuffer");
        }
    }
    else if (ViewDesc.NumArraySlices == m_Desc.ArraySize)
    {
        // glFramebufferTexture() attaches the given mipmap level as a layered image with the number of layers that the given texture has.
        if (Targets & FRAMEBUFFER_TARGET_FLAG_DRAW)
        {
            VERIFY_EXPR(ViewDesc.ViewType == TEXTURE_VIEW_RENDER_TARGET || ViewDesc.ViewType == TEXTURE_VIEW_DEPTH_STENCIL);
            glFramebufferTexture(GL_DRAW_FRAMEBUFFER, AttachmentPoint, m_GlTexture, ViewDesc.MostDetailedMip);
            DEV_CHECK_GL_ERROR("Failed to attach texture cubemap array to draw framebuffer");
        }
        if (Targets & FRAMEBUFFER_TARGET_FLAG_READ)
        {
            glFramebufferTexture(GL_READ_FRAMEBUFFER, AttachmentPoint, m_GlTexture, ViewDesc.MostDetailedMip);
            DEV_CHECK_GL_ERROR("Failed to attach texture cubemap array to read framebuffer");
        }
    }
    else
    {
        UNEXPECTED("Only one slice or the entire cubemap array can be attached to a framebuffer");
    }
}